

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

bool __thiscall
tlx::CmdlineParser::ArgumentDouble::process(ArgumentDouble *this,int *argc,char ***argv)

{
  double dVar1;
  char *local_30;
  char *endptr;
  char ***argv_local;
  int *argc_local;
  ArgumentDouble *this_local;
  
  if (*argc == 0) {
    this_local._7_1_ = false;
  }
  else {
    endptr = (char *)argv;
    argv_local = (char ***)argc;
    argc_local = (int *)this;
    dVar1 = strtod(**argv,&local_30);
    *this->dest_ = dVar1;
    if ((local_30 == (char *)0x0) || (*local_30 != '\0')) {
      this_local._7_1_ = false;
    }
    else {
      *(int *)argv_local = *(int *)argv_local + -1;
      *(long *)endptr = *(long *)endptr + 8;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        char* endptr;
        dest_ = strtod(argv[0], &endptr);
        if (endptr != nullptr && *endptr == 0) {
            --argc, ++argv;
            return true;
        }
        else {
            return false;
        }
    }